

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O0

int __thiscall
deqp::egl::anon_unknown_1::RobustnessTestCase::init(RobustnessTestCase *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  NativeDisplay *nativeDisplay;
  EGLDisplay pvVar1;
  EGLConfig pvVar2;
  RobustnessTestCase *this_local;
  
  nativeDisplay = EglTestContext::getNativeDisplay((this->super_TestCase).m_eglTestCtx);
  pvVar1 = eglu::getAndInitDisplay(nativeDisplay,(Version *)0x0);
  this->m_eglDisplay = pvVar1;
  pvVar2 = getEGLConfig(this);
  this->m_eglConfig = pvVar2;
  initEGLSurface(this);
  return extraout_EAX;
}

Assistant:

void RobustnessTestCase::init (void)
{
	m_eglDisplay	= eglu::getAndInitDisplay(m_eglTestCtx.getNativeDisplay());
	m_eglConfig		= getEGLConfig();

	initEGLSurface();
}